

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *matrixIndices,double *inMatrices,
          double *paddedValues,int count)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  float *to;
  double *from;
  int j;
  int iVar4;
  ulong uVar5;
  
  for (uVar5 = 0; uVar5 != (uint)(~(count >> 0x1f) & count); uVar5 = uVar5 + 1) {
    uVar1 = this->kStateCount;
    uVar3 = (ulong)uVar1;
    iVar4 = this->kCategoryCount;
    from = inMatrices + (int)(uVar1 * iVar4 * (int)uVar5 * uVar1);
    to = this->gTransitionMatrices[matrixIndices[uVar5]];
    for (iVar2 = 0; iVar2 < iVar4; iVar2 = iVar2 + 1) {
      iVar4 = 0;
      while( true ) {
        if ((int)(uint)uVar3 <= iVar4) break;
        beagleMemCpy<float,double_const>(to,from,(uint)uVar3);
        uVar3 = (ulong)this->kStateCount;
        iVar4 = iVar4 + 1;
        from = from + uVar3;
        to[uVar3] = (float)paddedValues[uVar5];
        to = to + this->kTransPaddedStateCount;
      }
      iVar4 = this->kCategoryCount;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrices(const int* matrixIndices,
                                                             const double* inMatrices,
                                                             const double* paddedValues,
                                                             int count) {
    for (int k = 0; k < count; k++) {
        const double* inMatrix = inMatrices + k*kStateCount*kStateCount*kCategoryCount;
        int matrixIndex = matrixIndices[k];

if (T_PAD != 0) {
        const double* offsetInMatrix = inMatrix;
        REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
        for(int i = 0; i < kCategoryCount; i++) {
            for(int j = 0; j < kStateCount; j++) {
                beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
                offsetBeagleMatrix[kStateCount] = paddedValues[k];
                offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
                offsetInMatrix += kStateCount;
            }
        }
} else {
        beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                     kMatrixSize * kCategoryCount);
}
    }

    return BEAGLE_SUCCESS;
}